

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall iqnet::ssl::Ctx::prepare_verify(Ctx *this,SSL *ssl,bool server)

{
  type pIVar1;
  ConnectionVerifier *local_40;
  uint local_2c;
  int mode;
  ConnectionVerifier *v;
  bool server_local;
  SSL *ssl_local;
  Ctx *this_local;
  
  if (server) {
    pIVar1 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
    local_40 = pIVar1->client_verifier;
  }
  else {
    pIVar1 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
    local_40 = pIVar1->server_verifier;
  }
  local_2c = (uint)(local_40 != (ConnectionVerifier *)0x0);
  if ((server) &&
     (pIVar1 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_),
     (pIVar1->require_client_cert & 1U) != 0)) {
    local_2c = local_2c | 2;
  }
  if (local_40 == (ConnectionVerifier *)0x0) {
    SSL_set_verify((SSL *)ssl,local_2c,(callback *)0x0);
  }
  else {
    SSL_set_verify((SSL *)ssl,local_2c,anon_unknown_9::iqxmlrpc_SSL_verify);
    SSL_set_ex_data((SSL *)ssl,iqxmlrpc_ssl_data_idx,local_40);
  }
  return;
}

Assistant:

void
Ctx::prepare_verify(SSL* ssl, bool server)
{
  ConnectionVerifier* v = server ? impl_->client_verifier : impl_->server_verifier;
  int mode = v ? SSL_VERIFY_PEER : SSL_VERIFY_NONE;

  if (server && impl_->require_client_cert)
    mode |= SSL_VERIFY_FAIL_IF_NO_PEER_CERT;

  if (v) {
    SSL_set_verify(ssl, mode, iqxmlrpc_SSL_verify);
    SSL_set_ex_data(ssl, iqxmlrpc_ssl_data_idx, (void*)v);
  } else {
    SSL_set_verify(ssl, mode, 0);
  }
}